

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ion_file.c
# Opt level: O3

ion_err_t ion_fread_at(ion_file_handle_t file,ion_file_offset_t offset,uint num_bytes,
                      ion_byte_t *write_to)

{
  char cVar1;
  int iVar2;
  size_t sVar3;
  
  iVar2 = fseek((FILE *)file,offset,0);
  cVar1 = '\r';
  if (iVar2 == 0) {
    sVar3 = fread(write_to,(ulong)num_bytes,1,(FILE *)file);
    cVar1 = (sVar3 != 1) << 3;
  }
  return cVar1;
}

Assistant:

ion_err_t
ion_fread_at(
	ion_file_handle_t	file,
	ion_file_offset_t	offset,
	unsigned int		num_bytes,
	ion_byte_t			*write_to
) {
	ion_err_t error;

	error = ion_fseek(file, offset, ION_FILE_START);

	if (err_ok != error) {
		return error;
	}

	error = ion_fread(file, num_bytes, write_to);
	return error;
}